

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QMdiArea::timerEvent(QMdiArea *this,QTimerEvent *timerEvent)

{
  QMdiAreaPrivate *this_00;
  QPointer<QMdiSubWindow> *pQVar1;
  Data *pDVar2;
  long lVar3;
  QObject *subWindow;
  
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (*(TimerId *)(timerEvent + 0x10) == (this_00->resizeTimer).m_id) {
    QBasicTimer::stop();
    QMdiAreaPrivate::arrangeMinimizedSubWindows(this_00);
    return;
  }
  if (*(TimerId *)(timerEvent + 0x10) == (this_00->tabToPreviousTimer).m_id) {
    QBasicTimer::stop();
    lVar3 = (long)this_00->indexToHighlighted;
    if (-1 < lVar3) {
      pQVar1 = (this_00->childWindows).d.ptr;
      pDVar2 = pQVar1[lVar3].wp.d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        subWindow = (QObject *)0x0;
      }
      else {
        subWindow = pQVar1[lVar3].wp.value;
      }
      QMdiAreaPrivate::showRubberBandFor(this_00,(QMdiSubWindow *)subWindow);
      return;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }